

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

hugeint_t duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>::
          Operation<duckdb::uhugeint_t,duckdb::hugeint_t>
                    (uhugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  hugeint_t hVar2;
  hugeint_t result_value;
  VectorDecimalCastData *data;
  VectorTryCastData *in_stack_ffffffffffffff48;
  idx_t in_stack_ffffffffffffff50;
  ValidityMask *in_stack_ffffffffffffff58;
  string *error_message;
  uint8_t in_stack_ffffffffffffff76;
  uint8_t in_stack_ffffffffffffff77;
  CastParameters *in_stack_ffffffffffffff78;
  hugeint_t *in_stack_ffffffffffffff80;
  uhugeint_t in_stack_ffffffffffffff88;
  uint64_t local_50;
  int64_t local_48;
  
  bVar1 = TryCastToDecimal::Operation<duckdb::uhugeint_t,duckdb::hugeint_t>
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff77,in_stack_ffffffffffffff76);
  if (bVar1) {
    hVar2.upper = local_48;
    hVar2.lower = local_50;
  }
  else {
    error_message = (string *)&stack0xffffffffffffff7f;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff80,"Failed to cast decimal value",
               (allocator *)error_message);
    hVar2 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                      (error_message,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff48);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  }
  return hVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}